

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialaddress.cpp
# Opt level: O0

void __thiscall
ElementsConfidentialAddress_P2pkhAddress_Test::ElementsConfidentialAddress_P2pkhAddress_Test
          (ElementsConfidentialAddress_P2pkhAddress_Test *this)

{
  ElementsConfidentialAddress_P2pkhAddress_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__ElementsConfidentialAddress_P2pkhAddress_Test_009eca10;
  return;
}

Assistant:

TEST(ElementsConfidentialAddress, P2pkhAddress) {
  const Pubkey pubkey = Pubkey(
      "027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af");
  ConfidentialKey key = ConfidentialKey(
      "02d570f84ffe5bdf7583400af2e6b9e219210ecf29a333757481cbca826ada8e16");
  ElementsConfidentialAddress address;
  Address unblind_addr;

  unblind_addr = Address(ElementsNetType::kLiquidV1, pubkey, GetElementsAddressFormatList());
  EXPECT_NO_THROW((address = ElementsConfidentialAddress(unblind_addr, key)));
  EXPECT_STREQ(
      "VTpyoufXeg8LByRmUeHt1zyzFm1RjEP7PvWYHsjGtj9Ef1ibxgVoGkPsUPDNvkKog17K7Qn5eQ3B7g9w",
      address.GetAddress().c_str());
  EXPECT_STREQ(
      "02d570f84ffe5bdf7583400af2e6b9e219210ecf29a333757481cbca826ada8e16",
      address.GetConfidentialKey().GetHex().c_str());
  EXPECT_STREQ("925d4028880bd0c9d68fbc7fc7dfee976698629c",
               address.GetHash().GetHex().c_str());
  EXPECT_STREQ("QAcHVN55oetZU3wXXxnTrYHaqVUe35UhwJ",
               address.GetUnblindedAddress().GetAddress().c_str());
  EXPECT_TRUE(
      ElementsConfidentialAddress::IsConfidentialAddress(address.GetAddress()));
  EXPECT_EQ(ElementsNetType::kLiquidV1, address.GetNetType());
  EXPECT_EQ(ElementsAddressType::kP2pkhAddress, address.GetAddressType());
  EXPECT_STREQ("76a914925d4028880bd0c9d68fbc7fc7dfee976698629c88ac",
               address.GetLockingScript().GetHex().c_str());

  unblind_addr = Address(ElementsNetType::kElementsRegtest, pubkey, GetElementsAddressFormatList());
  EXPECT_NO_THROW((address = ElementsConfidentialAddress(unblind_addr, key)));
  EXPECT_STREQ(
      "CTEqTvCZtF8yBn4JeRxJKDjsVWk7m9mMuzThGzwTgn9G8cLBqjmqc5YkyheitzBooX7XBVNmAS34Be8o",
      address.GetAddress().c_str());
  EXPECT_STREQ(
      "02d570f84ffe5bdf7583400af2e6b9e219210ecf29a333757481cbca826ada8e16",
      address.GetConfidentialKey().GetHex().c_str());
  EXPECT_STREQ("925d4028880bd0c9d68fbc7fc7dfee976698629c",
               address.GetHash().GetHex().c_str());
  EXPECT_STREQ("2dnmekh8NBmNX3Ckwte5CArjcsHLYdthCg3",
               address.GetUnblindedAddress().GetAddress().c_str());
  EXPECT_TRUE(
      ElementsConfidentialAddress::IsConfidentialAddress(address.GetAddress()));
  EXPECT_EQ(ElementsNetType::kElementsRegtest, address.GetNetType());
  EXPECT_EQ(ElementsAddressType::kP2pkhAddress, address.GetAddressType());
  EXPECT_STREQ("76a914925d4028880bd0c9d68fbc7fc7dfee976698629c88ac",
               address.GetLockingScript().GetHex().c_str());

  // uncompress pubkey
  ConfidentialKey uc_key =
      ConfidentialKey(
          "04d570f84ffe5bdf7583400af2e6b9e219210ecf29a333757481cbca826ada8e16e50cd61e20eb14e59a0c763d9cda790becb868ceeb00e5f74da0d15ff8381534");
  EXPECT_THROW((address = ElementsConfidentialAddress(unblind_addr, uc_key)),
               CfdException);

  // copy check
  ElementsConfidentialAddress ca(address);
  EXPECT_EQ(address.GetAddress(), ca.GetAddress());
}